

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexFilters.cpp
# Opt level: O3

void __thiscall Ptex::v2_2::PtexBicubicFilter::~PtexBicubicFilter(PtexBicubicFilter *this)

{
  operator_delete(this,0x80);
  return;
}

Assistant:

PtexBicubicFilter(PtexTexture* tx, const PtexFilter::Options& opts, float sharpness)
        : PtexWidth4Filter(tx, opts, kernelFn, _coeffs)
    {
        // compute Cubic filter coefficients:
        // abs(x) < 1:
        //   1/6 * ((12 - 9*B - 6*C)*x^3 + (-18 + 12*B + 6*C)*x^2 + (6 - 2*B))
        //   == c[0]*x^3 + c[1]*x^2 + c[2]
        // abs(x) < 2:
        //   1/6 * ((-B - 6*C)*x^3 + (6*B + 30*C)*x^2 + (-12*B - 48*C)*x + (8*B + 24*C))
        //   == c[3]*x^3 + c[4]*x^2 + c[5]*x + c[6]
        // else: 0

        float B = 1.0f - sharpness; // choose C = (1-B)/2
        _coeffs[0] = 1.5f - B;
        _coeffs[1] = 1.5f * B - 2.5f;
        _coeffs[2] = 1.0f - float(1.0/3.0) * B;
        _coeffs[3] = float(1.0/3.0) * B - 0.5f;
        _coeffs[4] = 2.5f - 1.5f * B;
        _coeffs[5] = 2.0f * B - 4.0f;
        _coeffs[6] = 2.0f - float(2.0/3.0) * B;
    }